

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

uint32 __thiscall TTD::TTEventList::Count(TTEventList *this)

{
  EventLogEntryVTableEntry **ppEVar1;
  TTEventListLink *pTVar2;
  uint32 uVar3;
  size_t sVar4;
  
  ppEVar1 = &this->m_vtable;
  uVar3 = 0;
  while (pTVar2 = this->m_headBlock, pTVar2 != (TTEventListLink *)0x0) {
    for (sVar4 = pTVar2->StartPos; sVar4 != pTVar2->CurrPos;
        sVar4 = sVar4 + (*ppEVar1)[*(uint *)(pTVar2->BlockData + sVar4)].DataSize) {
      uVar3 = uVar3 + 1;
    }
    this = (TTEventList *)&pTVar2->Previous;
  }
  return uVar3;
}

Assistant:

uint32 TTEventList::Count() const
    {
        uint32 count = 0;

        for(TTEventListLink* curr = this->m_headBlock; curr != nullptr; curr = curr->Previous)
        {
            size_t cpos = curr->StartPos;
            while(cpos != curr->CurrPos)
            {
                count++;

                NSLogEvents::EventLogEntry* data = reinterpret_cast<NSLogEvents::EventLogEntry*>(curr->BlockData + cpos);
                cpos += this->m_vtable[(uint32)data->EventKind].DataSize;
            }
        }

        return count;
    }